

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError PaUtil_GetHostApiRepresentation(PaUtilHostApiRepresentation **hostApi,PaHostApiTypeId type)

{
  PaUtilHostApiRepresentation **ppPVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (initializationCount_ == 0) {
    return -10000;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)hostApisCount_;
  if (hostApisCount_ < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return -0x26fb;
    }
    ppPVar1 = hostApis_ + uVar3;
    uVar3 = uVar3 + 1;
  } while (((*ppPVar1)->info).type != type);
  *hostApi = *ppPVar1;
  return 0;
}

Assistant:

PaError PaUtil_GetHostApiRepresentation( struct PaUtilHostApiRepresentation **hostApi,
        PaHostApiTypeId type )
{
    PaError result;
    int i;
    
    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;
                
        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                *hostApi = hostApis_[i];
                result = paNoError;
                break;
            }
        }
    }

    return result;
}